

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::GlobMultiFileList::ComplexFilterPushdown
          (GlobMultiFileList *this,ClientContext *context_p,MultiFileOptions *options,
          MultiFilePushdownInfo *info,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *filters)

{
  pthread_mutex_t *__mutex;
  ClientConfig *__x;
  bool bVar1;
  int iVar2;
  SimpleMultiFileList *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_R9;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_48;
  
  __mutex = (pthread_mutex_t *)((long)&(context_p->config).home_directory.field_2 + 8);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  __x = &context_p->config;
  do {
    bVar1 = ExpandPathInternal((GlobMultiFileList *)context_p,(idx_t *)&context_p->logger,
                               (vector<duckdb::OpenFileInfo,_true> *)__x);
  } while (bVar1);
  if ((*(char *)((long)&info->table_index + 1) != '\0') || ((char)info->table_index != '\0')) {
    bVar1 = PushdownInternal((ClientContext *)
                             (context_p->registered_state).
                             super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                             .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                             _M_head_impl,(MultiFileOptions *)info,(MultiFilePushdownInfo *)filters,
                             in_R9,(vector<duckdb::OpenFileInfo,_true> *)__x);
    if (bVar1) {
      this_00 = (SimpleMultiFileList *)operator_new(0x28);
      ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
                (&local_48,
                 (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)__x);
      SimpleMultiFileList::SimpleMultiFileList
                (this_00,(vector<duckdb::OpenFileInfo,_true> *)&local_48);
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_48);
      goto LAB_015afafa;
    }
  }
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
  this_00 = (SimpleMultiFileList *)0x0;
LAB_015afafa:
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)this_00;
  pthread_mutex_unlock(__mutex);
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

unique_ptr<MultiFileList> GlobMultiFileList::ComplexFilterPushdown(ClientContext &context_p,
                                                                   const MultiFileOptions &options,
                                                                   MultiFilePushdownInfo &info,
                                                                   vector<unique_ptr<Expression>> &filters) {
	lock_guard<mutex> lck(lock);

	// Expand all
	// FIXME: lazy expansion
	// FIXME: push down filters into glob
	while (ExpandNextPath()) {
	}

	if (!options.hive_partitioning && !options.filename) {
		return nullptr;
	}
	auto res = PushdownInternal(context, options, info, filters, expanded_files);
	if (res) {
		return make_uniq<SimpleMultiFileList>(expanded_files);
	}

	return nullptr;
}